

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O3

symbol * evaluate_preop(dmr_C *C,expression *expr)

{
  expression **ppeVar1;
  byte bVar2;
  statement *psVar3;
  statement *psVar4;
  statement *psVar5;
  position pVar6;
  symbol_list *psVar7;
  statement *psVar8;
  expression *peVar9;
  undefined8 uVar10;
  statement *psVar11;
  statement *psVar12;
  ident *piVar13;
  symbol *psVar14;
  symbol *psVar15;
  anon_union_8_2_e1606681_for_symbol_12 aVar16;
  symbol **ppsVar17;
  statement_type sVar18;
  undefined4 uVar19;
  char cVar20;
  int iVar21;
  symbol *psVar22;
  statement_list *sym;
  string *psVar23;
  char *pcVar24;
  expression *peVar25;
  symbol *psVar26;
  uint uVar27;
  statement_list *psVar28;
  statement_list *local_38;
  
  psVar3 = (expr->field_5).statement;
  psVar28 = (psVar3->field_2).field_4.stmts;
  iVar21 = expr->op;
  local_38 = psVar28;
  if (0x7d < iVar21) {
    if (iVar21 == 0x7e) goto switchD_0010c196_caseD_2b;
    if ((iVar21 == 0x101) || (iVar21 == 0x103)) {
      psVar22 = evaluate_postop(C,expr);
      return psVar22;
    }
    goto switchD_0010c196_caseD_22;
  }
  switch(iVar21) {
  case 0x21:
    if ((0xff < *(ushort *)expr) && ((psVar3->type & 0x100) == STMT_NONE)) {
      *(ushort *)expr = *(ushort *)expr & 0xff;
    }
    if ((*(undefined1 *)((long)psVar28->list_ + 0x43) & 8) != 0) {
      dmrC_warning(C,expr->pos,"testing a \'safe expression\'");
    }
    cVar20 = *(char *)psVar28;
    psVar22 = (symbol *)psVar28->list_[0xc];
    if (cVar20 == '\x03') {
      psVar26 = (psVar22->field_14).field_2.ctype.base_type;
      if (psVar26 == &C->S->fp_type) goto LAB_0010c4bc;
      cVar20 = *(char *)psVar22;
LAB_0010c48d:
      if (cVar20 == '\t') {
        cVar20 = *(char *)psVar26;
      }
      if (cVar20 == '\x10') {
        pcVar24 = dmrC_show_typename(C,psVar22);
        dmrC_warning(C,expr->pos,"%s degrades to integer",pcVar24);
      }
    }
    else {
      psVar26 = psVar22;
      if (psVar22 != &C->S->fp_type) goto LAB_0010c48d;
LAB_0010c4bc:
      *(undefined1 *)expr = 0x16;
      expr->op = 0x10a;
      pVar6 = expr->pos;
      psVar23 = (string *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(undefined1 *)psVar23 = 0x1c;
      *(position *)(psVar23 + 2) = pVar6;
      (expr->field_5).field_2.string = psVar23;
      *(statement_list **)(psVar23 + 4) = psVar28;
      (((expr->field_5).field_6.right)->field_5).fvalue = (longdouble)0;
    }
    local_38 = (statement_list *)&C->S->int_ctype;
  default:
switchD_0010c196_caseD_22:
    expr->ctype = (symbol *)local_38;
    break;
  case 0x26:
    if ((*(int *)&psVar3->pos == 0x2a) && ((char)psVar3->type == STMT_LABEL)) {
      psVar3 = (psVar3->field_2).field_3.if_false;
      uVar19 = *(undefined4 *)&(psVar3->pos).field_0x0;
      pVar6 = *(position *)&(psVar3->pos).field_0x4;
      psVar7 = (psVar3->field_2).field_0.declaration;
      peVar25 = (psVar3->field_2).field_1.context;
      psVar4 = (psVar3->field_2).field_3.if_false;
      psVar5 = (psVar3->field_2).field_4.args;
      peVar9 = (psVar3->field_2).field_8.iterator_pre_condition;
      psVar8 = (psVar3->field_2).field_8.iterator_statement;
      *(statement_type *)&expr->field_0x0 = psVar3->type;
      expr->op = uVar19;
      expr->pos = pVar6;
      (expr->field_5).field_10.cond_false = peVar9;
      (expr->field_5).field_14.ident_expression = (expression *)psVar8;
      (expr->field_5).field_0.value = (unsigned_long_long)psVar4;
      (expr->field_5).field_2.string = (string *)psVar5;
      expr->ctype = (symbol *)psVar7;
      *(expression **)&expr->field_0x18 = peVar25;
      bVar2 = *(byte *)expr;
      *(ushort *)expr = (ushort)bVar2;
      if (bVar2 == 3) {
        ppeVar1 = ((expr->field_5).expr_list)->list_ + 8;
        *ppeVar1 = (expression *)((ulong)*ppeVar1 | 0x80000);
      }
      if (expr->ctype != &C->S->lazy_ptr_ctype) {
        return expr->ctype;
      }
      psVar22 = create_pointer(C,expr,(symbol *)psVar28,0);
      expr->ctype = psVar22;
      return psVar22;
    }
    pcVar24 = "not addressable";
    goto LAB_0010c633;
  case 0x28:
    sVar18 = psVar3->type;
    uVar19 = *(undefined4 *)&(psVar3->pos).field_0x0;
    pVar6 = *(position *)&(psVar3->pos).field_0x4;
    psVar7 = (psVar3->field_2).field_0.declaration;
    peVar25 = (psVar3->field_2).field_1.context;
    psVar4 = (psVar3->field_2).field_3.if_false;
    psVar5 = (psVar3->field_2).field_4.args;
    psVar8 = (psVar3->field_2).field_8.iterator_statement;
    (expr->field_5).field_10.cond_false = (psVar3->field_2).field_8.iterator_pre_condition;
    (expr->field_5).field_14.ident_expression = (expression *)psVar8;
    (expr->field_5).field_0.value = (unsigned_long_long)psVar4;
    (expr->field_5).field_2.string = (string *)psVar5;
    expr->ctype = (symbol *)psVar7;
    *(expression **)&expr->field_0x18 = peVar25;
    *(statement_type *)&expr->field_0x0 = sVar18;
    expr->op = uVar19;
    expr->pos = pVar6;
    return (symbol *)psVar28;
  case 0x2a:
    if (((char)psVar3->type == STMT_LABEL) && (*(int *)&psVar3->pos == 0x26)) {
      psVar3 = (psVar3->field_2).field_3.if_false;
      uVar19 = *(undefined4 *)&(psVar3->pos).field_0x0;
      pVar6 = *(position *)&(psVar3->pos).field_0x4;
      psVar7 = (psVar3->field_2).field_0.declaration;
      peVar25 = (psVar3->field_2).field_1.context;
      psVar4 = (psVar3->field_2).field_3.if_false;
      psVar5 = (psVar3->field_2).field_4.args;
      peVar9 = (psVar3->field_2).field_8.iterator_pre_condition;
      psVar8 = (psVar3->field_2).field_8.iterator_statement;
      *(statement_type *)&expr->field_0x0 = psVar3->type;
      expr->op = uVar19;
      expr->pos = pVar6;
      expr->ctype = (symbol *)psVar7;
      *(expression **)&expr->field_0x18 = peVar25;
      (expr->field_5).field_10.cond_false = peVar9;
      (expr->field_5).field_14.ident_expression = (expression *)psVar8;
      (expr->field_5).field_0.value = (unsigned_long_long)psVar4;
      (expr->field_5).field_2.string = (string *)psVar5;
      expr->field_0x1 = 0;
      return expr->ctype;
    }
    dmrC_examine_symbol_type(C->S,(symbol *)psVar28);
    if (*(char *)psVar28 == '\x03') {
      psVar28 = (statement_list *)psVar28->list_[0xc];
    }
    sym = (statement_list *)dmrC_alloc_symbol(C->S,expr->pos,3);
    psVar4 = psVar28->list_[0xc];
    if (*(char *)psVar28 == '\x04') {
      sym->list_[8] = (statement *)(ulong)((uint)*(undefined8 *)&psVar4[1].field_2 & 0x40001fc0);
    }
    else {
      if (*(char *)psVar28 != '\x06') {
        pcVar24 = "cannot dereference this type";
LAB_0010c633:
        dmrC_expression_error(C,expr,pcVar24);
        return (symbol *)0x0;
      }
      if (((char)psVar3->type != STMT_LABEL) || (*(int *)&psVar3->pos != 0x2a)) {
        pcVar24 = "non-lvalue array??";
        expr = (expression *)psVar3;
        goto LAB_0010c633;
      }
      psVar5 = (psVar3->field_2).field_3.if_false;
      sVar18 = psVar5->type;
      uVar19 = *(undefined4 *)&(psVar5->pos).field_0x0;
      uVar10 = *(undefined8 *)&(psVar5->pos).field_0x4;
      peVar25 = (psVar5->field_2).field_1.context;
      psVar8 = (psVar5->field_2).field_3.if_false;
      psVar11 = (psVar5->field_2).field_4.args;
      peVar9 = (psVar5->field_2).field_8.iterator_pre_condition;
      psVar12 = (psVar5->field_2).field_8.iterator_statement;
      (psVar3->field_2).field_0.declaration = (psVar5->field_2).field_0.declaration;
      (psVar3->field_2).field_1.context = peVar25;
      psVar3->type = sVar18;
      *(undefined4 *)&(psVar3->pos).field_0x0 = uVar19;
      *(undefined8 *)&(psVar3->pos).field_0x4 = uVar10;
      (psVar3->field_2).field_8.iterator_pre_condition = peVar9;
      (psVar3->field_2).field_8.iterator_statement = psVar12;
      (psVar3->field_2).field_3.if_false = psVar8;
      (psVar3->field_2).field_4.args = psVar11;
      dmrC_merge_type((symbol *)sym,(psVar3->field_2).field_5.label_identifier);
    }
    dmrC_merge_type((symbol *)sym,(symbol *)psVar28);
    *(statement_type *)(sym->list_ + 6) = psVar4[1].type;
    sym->list_[7] = (statement *)*(undefined8 *)&psVar4[1].pos.field_0x4;
    local_38 = sym;
    goto LAB_0010c697;
  case 0x2b:
  case 0x2d:
switchD_0010c196_caseD_2b:
    bVar2 = *(byte *)psVar28;
    if (bVar2 == 3) {
      local_38 = (statement_list *)psVar28->list_[0xc];
      bVar2 = *(byte *)local_38;
    }
    if (bVar2 == 0xb) {
      ppsVar17 = (symbol **)local_38->list_;
      local_38 = psVar28;
      local_38 = (statement_list *)dmrC_evaluate_expression(C,(expression *)ppsVar17[0x12]);
      if (local_38 == (statement_list *)0x0) {
        local_38 = (statement_list *)&C->S->bad_ctype;
      }
      else if (*(char *)local_38 == '\x03') {
        local_38 = (statement_list *)local_38->list_[0xc];
      }
    }
    if (*(byte *)local_38 == 9) {
      local_38 = (statement_list *)local_38->list_[0xc];
    }
    if ((ulong)*(byte *)local_38 == 2) {
      if ((symbol *)local_38->list_[0xc] == &C->S->int_type) {
        uVar27 = 1;
      }
      else {
        if ((symbol *)local_38->list_[0xc] != &C->S->fp_type) goto LAB_0010c463;
        uVar27 = 9;
      }
    }
    else {
LAB_0010c463:
      uVar27 = classify_type::type_class[*(byte *)local_38];
    }
    if ((0xff < *(ushort *)expr) && ((((expr->field_5).statement)->type & 0x100) == STMT_NONE)) {
      *(ushort *)expr = *(ushort *)expr & 0xff;
    }
    if ((uVar27 & 1) == 0) {
LAB_0010c52c:
      psVar22 = bad_expr_type(C,expr);
      return psVar22;
    }
    if (((uVar27 & 4) != 0) &&
       (iVar21 = restricted_unop(C,expr->op,(symbol **)&local_38), iVar21 != 0)) {
      psVar28 = local_38;
      if ((uVar27 & 0x40) != 0) {
        psVar28 = (statement_list *)local_38->list_[0xc];
      }
      pcVar24 = dmrC_show_typename(C,(symbol *)psVar28);
      dmrC_warning(C,expr->pos,"%s degrades to integer",pcVar24);
      local_38 = (statement_list *)psVar28->list_[0xc];
    }
    if ((uVar27 & 8) == 0) {
      ppsVar17 = (symbol **)local_38->list_;
      if (*(byte *)local_38 == 0xd) {
        local_38 = (statement_list *)local_38->list_[0xc];
      }
      if (*(int *)(ppsVar17 + 6) < C->target->bits_in_int) {
        local_38 = (statement_list *)&C->S->int_ctype;
      }
      else if (((ulong)local_38->list_[8] & 0x300) != 0) {
        if ((char)local_38->list_[8] < '\0') {
          local_38 = (statement_list *)&C->S->uint_ctype;
        }
        else {
          local_38 = (statement_list *)&C->S->int_ctype;
        }
      }
      peVar25 = cast_to(C,(expr->field_5).field_3.unop,(symbol *)local_38);
      (expr->field_5).field_3.unop = peVar25;
      iVar21 = expr->op;
    }
    else {
      iVar21 = expr->op;
      if (iVar21 == 0x7e) goto LAB_0010c52c;
    }
    if (iVar21 == 0x2b) {
      psVar22 = (expr->field_5).field_4.symbol;
      uVar19 = *(undefined4 *)&(psVar22->pos).field_0x0;
      pVar6 = *(position *)&(psVar22->pos).field_0x4;
      psVar26 = *(symbol **)&(psVar22->endpos).field_0x4;
      piVar13 = psVar22->ident;
      psVar14 = psVar22->next_id;
      psVar15 = psVar22->replace;
      peVar25 = (expression *)psVar22->scope;
      aVar16 = psVar22->field_12;
      *(undefined4 *)&expr->field_0x0 = *(undefined4 *)&psVar22->field_0x0;
      expr->op = uVar19;
      expr->pos = pVar6;
      expr->ctype = psVar26;
      *(ident **)&expr->field_0x18 = piVar13;
      (expr->field_5).field_10.cond_false = peVar25;
      (expr->field_5).field_14.ident_expression = (expression *)aVar16;
      (expr->field_5).field_0.value = (unsigned_long_long)psVar14;
      (expr->field_5).field_2.string = (string *)psVar15;
    }
LAB_0010c697:
    expr->ctype = (symbol *)local_38;
  }
  return (symbol *)local_38;
}

Assistant:

static struct symbol *evaluate_preop(struct dmr_C *C, struct expression *expr)
{
	struct symbol *ctype = expr->unop->ctype;

	switch (expr->op) {
	case '(':
		*expr = *expr->unop;
		return ctype;

	case '+':
	case '-':
	case '~':
		return evaluate_sign(C, expr);

	case '*':
		return evaluate_dereference(C, expr);

	case '&':
		return evaluate_addressof(C, expr);

	case SPECIAL_INCREMENT:
	case SPECIAL_DECREMENT:
		/*
		 * From a type evaluation standpoint the preops are
		 * the same as the postops
		 */
		return evaluate_postop(C, expr);

	case '!':
		if (expr->flags && !(expr->unop->flags & Int_const_expr))
			expr->flags = 0;
		if (is_safe_type(ctype))
			dmrC_warning(C, expr->pos, "testing a 'safe expression'");
		if (dmrC_is_float_type(C->S, ctype)) {
			struct expression *arg = expr->unop;
			expr->type = EXPR_COMPARE;
			expr->op = SPECIAL_EQUAL;
			expr->left = arg;
			expr->right = dmrC_alloc_expression(C, expr->pos, EXPR_FVALUE);
			expr->right->ctype = ctype;
			expr->right->fvalue = 0;
		} else if (dmrC_is_fouled_type(ctype)) {
			dmrC_warning(C, expr->pos, "%s degrades to integer",
				dmrC_show_typename(C, ctype->ctype.base_type));
		}
		/* the result is int [6.5.3.3(5)]*/
		ctype = &C->S->int_ctype;
		break;

	default:
		break;
	}
	expr->ctype = ctype;
	return ctype;
}